

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QVariant * __thiscall
QHash<QString,_QVariant>::value
          (QVariant *__return_storage_ptr__,QHash<QString,_QVariant> *this,QString *key)

{
  Node<QString,_QVariant> *pNVar1;
  QVariant *p;
  
  if (this->d != (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::findNode<QString>
                       (this->d,key);
    if (pNVar1 != (Node<QString,_QVariant> *)0x0) {
      p = &pNVar1->value;
      goto LAB_002a95d1;
    }
  }
  p = (QVariant *)0x0;
LAB_002a95d1:
  if (p == (QVariant *)0x0) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    ::QVariant::QVariant(__return_storage_ptr__,p);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }